

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
          (ImmutableExtensionLiteGenerator *this,FieldDescriptor *descriptor,Context *context)

{
  Descriptor *descriptor_00;
  ClassNameResolver *this_00;
  string local_38;
  
  (this->super_ExtensionGenerator)._vptr_ExtensionGenerator =
       (_func_int **)&PTR__ImmutableExtensionLiteGenerator_0046f5c0;
  this->descriptor_ = descriptor;
  this_00 = Context::GetNameResolver(context);
  this->name_resolver_ = this_00;
  (this->scope_)._M_dataplus._M_p = (pointer)&(this->scope_).field_2;
  (this->scope_)._M_string_length = 0;
  (this->scope_).field_2._M_local_buf[0] = '\0';
  descriptor_00 = *(Descriptor **)(this->descriptor_ + 0x60);
  if (descriptor_00 == (Descriptor *)0x0) {
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_38,this_00,*(FileDescriptor **)(this->descriptor_ + 0x28),true);
  }
  else {
    ClassNameResolver::GetClassName_abi_cxx11_(&local_38,this_00,descriptor_00,true);
  }
  std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator(
    const FieldDescriptor* descriptor, Context* context)
    : descriptor_(descriptor), name_resolver_(context->GetNameResolver()) {
  if (descriptor_->extension_scope() != NULL) {
    scope_ =
        name_resolver_->GetImmutableClassName(descriptor_->extension_scope());
  } else {
    scope_ = name_resolver_->GetImmutableClassName(descriptor_->file());
  }
}